

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O2

bool anon_unknown.dwarf_7b528::class_or_subclass_have_properties(MetaClass *top)

{
  __shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  __shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  shared_ptr<MetaClass> child;
  __shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (top == (MetaClass *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if ((top->properties).
        super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (top->properties).
        super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      p_Var3 = &((top->subclasses).
                 super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>;
      p_Var1 = &((top->subclasses).
                 super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>;
      do {
        bVar4 = p_Var3 == p_Var1;
        bVar2 = !bVar4;
        if (bVar4) {
          return bVar2;
        }
        std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,p_Var3);
        bVar4 = class_or_subclass_have_properties(local_40._M_ptr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        p_Var3 = p_Var3 + 1;
      } while (!bVar4);
    }
  }
  return bVar2;
}

Assistant:

bool class_or_subclass_have_properties(MetaClass *top) {
  if (!top)
    return false;
  if (top->properties.size() != 0) {
    return true;
  }

  for (auto child : top->subclasses) {
    if (class_or_subclass_have_properties(child.get())) {
      return true;
    }
  }
  return false;
}